

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void expression_char(ch_compilation *comp)

{
  int local_2c [2];
  ch_op op_2;
  ch_op op_1;
  ch_op op;
  ch_lexeme value;
  ch_compilation *comp_local;
  
  _op_1 = (comp->previous).lexeme.start;
  value.start = (char *)(comp->previous).lexeme.size;
  op_2 = OP_CHAR;
  value.size = (size_t)comp;
  ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op_2,1);
  if (value.start == (char *)0x2) {
    local_2c[1] = 0;
    ch_emit_write(*(ch_blob **)(value.size + 0x70),local_2c + 1,1);
  }
  else {
    local_2c[0] = (int)_op_1[1];
    ch_emit_write(*(ch_blob **)(value.size + 0x70),local_2c,1);
  }
  return;
}

Assistant:

void expression_char(ch_compilation* comp) {
  ch_lexeme value = comp->previous.lexeme;
  
  EMIT_OP(GET_EMIT(comp), OP_CHAR);
  // 2 characters means the char expression is ''
  // In that case, we emit a null byte
  if (value.size == 2) {
      EMIT_OP(GET_EMIT(comp), 0);
      return;
  }

  EMIT_OP(GET_EMIT(comp), value.start[1]);
}